

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_ring.h
# Opt level: O2

void __thiscall
embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::convert
          (GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *this,CatmullClark1Ring *dst)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  uint uVar4;
  undefined8 uVar5;
  size_t i_1;
  float *pfVar6;
  long lVar7;
  Vec3fa *pVVar8;
  int iVar9;
  Vec3fa *pVVar10;
  size_t i;
  ulong uVar11;
  
  dst->edge_level = this->edge_level;
  dst->vertex_level = this->vertex_level;
  uVar5 = *(undefined8 *)((long)&(this->vtx).field_0 + 8);
  *(undefined8 *)&(dst->vtx).field_0 = *(undefined8 *)&(this->vtx).field_0;
  *(undefined8 *)((long)&(dst->vtx).field_0 + 8) = uVar5;
  uVar4 = this->face_valence;
  dst->face_valence = uVar4;
  dst->edge_valence = uVar4 * 2;
  iVar9 = this->border_face * 2;
  if (this->border_face == -1) {
    iVar9 = -1;
  }
  dst->border_index = iVar9;
  for (uVar11 = 0; uVar11 < this->face_valence; uVar11 = uVar11 + 1) {
    fVar3 = (this->faces).data[uVar11].crease_weight;
    pfVar6 = (dst->crease_weight).data;
    if ((0xf < uVar11) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar6 == &dst->crease_weight)) {
      pfVar6 = (float *)operator_new__(0x100);
      (dst->crease_weight).data = pfVar6;
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        (dst->crease_weight).data[lVar7] = (dst->crease_weight).arr[lVar7];
      }
      pfVar6 = (dst->crease_weight).data;
    }
    pfVar6[uVar11] = fVar3;
  }
  dst->vertex_crease_weight = this->vertex_crease_weight;
  for (uVar11 = 0; uVar11 < this->edge_valence; uVar11 = uVar11 + 1) {
    pVVar10 = (this->ring).data + uVar11;
    pVVar8 = (dst->ring).data;
    if ((0x1f < uVar11) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar8 == &dst->ring))
    {
      pVVar8 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      (dst->ring).data = pVVar8;
      for (lVar7 = 0; lVar7 != 0x200; lVar7 = lVar7 + 0x10) {
        puVar2 = (undefined8 *)((long)&(dst->ring).arr[0].field_0 + lVar7);
        uVar5 = puVar2[1];
        puVar1 = (undefined8 *)((long)&((dst->ring).data)->field_0 + lVar7);
        *puVar1 = *puVar2;
        puVar1[1] = uVar5;
      }
      pVVar8 = (dst->ring).data;
    }
    uVar5 = *(undefined8 *)((long)&pVVar10->field_0 + 8);
    *(undefined8 *)&pVVar8[uVar11].field_0 = *(undefined8 *)&pVVar10->field_0;
    *(undefined8 *)((long)&pVVar8[uVar11].field_0 + 8) = uVar5;
  }
  dst->eval_start_index = this->eval_start_face_index;
  dst->eval_unique_identifier = this->eval_unique_identifier;
  return;
}

Assistant:

void convert(CatmullClark1Ring& dst) const
    {
      dst.edge_level = edge_level;
      dst.vertex_level = vertex_level;
      dst.vtx = vtx;
      dst.face_valence = face_valence;
      dst.edge_valence = 2*face_valence;
      dst.border_index = border_face == -1 ? -1 : 2*border_face;
      for (size_t i=0; i<face_valence; i++) 
	dst.crease_weight[i] = faces[i].crease_weight;
      dst.vertex_crease_weight = vertex_crease_weight;
      for (size_t i=0; i<edge_valence; i++) dst.ring[i] = ring[i];

      dst.eval_start_index = eval_start_face_index;
      dst.eval_unique_identifier = eval_unique_identifier;

      assert( dst.hasValidPositions() );
    }